

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void nh_generate_http_response(http_context_t *ctx)

{
  nh_stream_t *stream_00;
  nh_header_t *local_28;
  nh_header_t *header;
  nh_response_t *response;
  nh_stream_t *stream;
  http_context_t *ctx_local;
  
  stream_00 = &(ctx->response).raw;
  nh_stream_write(stream_00,"HTTP/1.1 %u %s\r\n",(ulong)(ctx->response).status,
                  nh_http_status[(ctx->response).status]);
  for (local_28 = (ctx->response).header; local_28 != (nh_header_t *)0x0; local_28 = local_28->next)
  {
    nh_stream_write(stream_00,"%s: %s\r\n",local_28->key,local_28->value);
  }
  if ((ctx->response).body.len != 0) {
    nh_stream_write(stream_00,"Content-Length: %zu\r\n",(ctx->response).body.len);
  }
  nh_stream_write(stream_00,"\r\n");
  if ((ctx->response).body.len != 0) {
    nh_stream_copy(stream_00,(ctx->response).body.value,(uint32_t)(ctx->response).body.len);
  }
  return;
}

Assistant:

void nh_generate_http_response(http_context_t *ctx) {
    nh_stream_t *stream = &ctx->response.raw;
    nh_response_t *response = &ctx->response;

    // meta line
    nh_stream_write(stream, "HTTP/1.1 %u %s\r\n", response->status, nh_http_status[response->status]);

    // headers
    nh_header_t *header = response->header;
    while (header != NULL) {
        nh_stream_write(stream, "%s: %s\r\n", header->key, header->value);
        header = header->next;
    }
    // content-length
    if (response->body.len) {
        nh_stream_write(stream, "Content-Length: %zu\r\n", response->body.len);
    }
    nh_stream_write(stream, "\r\n");

    // body
    if (response->body.len) {
        nh_stream_copy(stream, response->body.value, response->body.len);
    }
}